

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTimer.cpp
# Opt level: O0

void __thiscall helics::MessageTimer::cancelAll(MessageTimer *this)

{
  bool bVar1;
  reference this_00;
  mutex_type *in_RDI;
  shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>
  *tmr;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
  *__range1_1;
  ActionMessage *buf;
  iterator __end1;
  iterator __begin1;
  vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *__range1;
  lock_guard<std::mutex> lock;
  reference in_stack_ffffffffffffffa0;
  __normal_iterator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_*,_std::vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>_>
  local_50;
  undefined1 *local_48;
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  *in_stack_ffffffffffffffc0;
  __normal_iterator<helics::ActionMessage_*,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
  local_20;
  undefined1 *local_18;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffffa0,in_RDI);
  local_18 = (undefined1 *)((long)&in_RDI[1].super___mutex_base._M_mutex + 0x10);
  local_20._M_current =
       (ActionMessage *)
       std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::begin
                 ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)in_RDI);
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::end
            ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<helics::ActionMessage_*,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
                      ((__normal_iterator<helics::ActionMessage_*,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<helics::ActionMessage_*,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
                        *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this_00 = __gnu_cxx::
              __normal_iterator<helics::ActionMessage_*,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
              ::operator*(&local_20);
    ActionMessage::setAction(this_00,cmd_ignore);
    __gnu_cxx::
    __normal_iterator<helics::ActionMessage_*,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
    ::operator++(&local_20);
  }
  local_48 = (undefined1 *)((long)&in_RDI[3].super___mutex_base._M_mutex + 0x10);
  local_50._M_current =
       (shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>
        *)std::
          vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
          ::begin((vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
                   *)in_RDI);
  std::
  vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
  ::end((vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
         *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_*,_std::vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>_>
                      ((__normal_iterator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_*,_std::vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_*,_std::vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>_>
                        *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffa0 =
         __gnu_cxx::
         __normal_iterator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_*,_std::vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>_>
         ::operator*(&local_50);
    std::
    __shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x5ecbd7);
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
    ::cancel(in_stack_ffffffffffffffc0);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_*,_std::vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>_>
    ::operator++(&local_50);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x5ecbf9);
  return;
}

Assistant:

void MessageTimer::cancelAll()
{
    std::lock_guard<std::mutex> lock(timerLock);
    for (auto& buf : buffers) {
        buf.setAction(CMD_IGNORE);
    }
    for (auto& tmr : timers) {
        tmr->cancel();
    }
}